

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void CheckMaybeEscapedUse(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,bool isCall)

{
  OpCode OVar1;
  bool bVar2;
  FuncInfo *this;
  ParseNodeBin *pPVar3;
  ParseNodeName *pPVar4;
  
  if (pnode != (ParseNode *)0x0) {
    this = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    bVar2 = FuncInfo::IsGlobalFunction(this);
    if (!bVar2) {
      OVar1 = pnode->nop;
      if (OVar1 == knopName) {
        if (isCall) {
          return;
        }
      }
      else {
        if (OVar1 == knopFncDecl) {
          FuncInfo::SetHasMaybeEscapedNestedFunc(this,L"UnknownUse");
          return;
        }
        if (OVar1 != knopAsg) {
          return;
        }
        pPVar3 = ParseNode::AsParseNodeBin(pnode);
        if (pPVar3->pnode1->nop != knopName) {
          return;
        }
        pPVar3 = ParseNode::AsParseNodeBin(pnode);
        pnode = pPVar3->pnode1;
      }
      pPVar4 = ParseNode::AsParseNodeName(pnode);
      if (pPVar4->sym != (Symbol *)0x0) {
        pPVar4 = ParseNode::AsParseNodeName(pnode);
        Symbol::SetHasMaybeEscapedUse(pPVar4->sym,byteCodeGenerator);
        return;
      }
    }
  }
  return;
}

Assistant:

void CheckMaybeEscapedUse(ParseNode * pnode, ByteCodeGenerator * byteCodeGenerator, bool isCall = false)
{
    if (pnode == nullptr)
    {
        return;
    }

    FuncInfo * topFunc = byteCodeGenerator->TopFuncInfo();
    if (topFunc->IsGlobalFunction())
    {
        return;
    }

    switch (pnode->nop)
    {
    case knopAsg:
        if (pnode->AsParseNodeBin()->pnode1->nop != knopName)
        {
            break;
        }
        // use of an assignment (e.g. (y = function() {}) + "1"), just make y an escaped use.
        pnode = pnode->AsParseNodeBin()->pnode1;
        isCall = false;
        // fall-through
    case knopName:
        if (!isCall)
        {
            // Mark the name has having escaped use
            if (pnode->AsParseNodeName()->sym)
            {
                pnode->AsParseNodeName()->sym->SetHasMaybeEscapedUse(byteCodeGenerator);
            }
        }
        break;

    case knopFncDecl:
        // A function declaration has an unknown use (not assignment nor call),
        // mark the function as having child escaped
        topFunc->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("UnknownUse")));
        break;
    }
}